

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

_Bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,_Bool clip)

{
  ImVec2 IVar1;
  ImGuiContext_conflict1 *pIVar2;
  _Bool _Var3;
  bool bVar4;
  undefined3 in_register_00000011;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImRect rect_clipped;
  ImRect rect_for_touch;
  ImRect local_30;
  ImRect local_20;
  
  pIVar2 = GImGui;
  local_30.Min = *r_min;
  local_30.Max = *r_max;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    ImRect::ClipWith(&local_30,&GImGui->CurrentWindow->ClipRect);
  }
  IVar1 = (pIVar2->Style).TouchExtraPadding;
  fVar5 = IVar1.x;
  local_20.Min.x = local_30.Min.x - fVar5;
  fVar6 = IVar1.y;
  local_20.Min.y = local_30.Min.y - fVar6;
  local_20.Max.x = local_30.Max.x + fVar5;
  local_20.Max.y = local_30.Max.y + fVar6;
  _Var3 = ImRect::Contains(&local_20,&(pIVar2->IO).MousePos);
  if (_Var3) {
    IVar7 = ImGuiViewportP::GetMainRect((ImGuiViewportP_conflict *)pIVar2->MouseViewport);
    bVar4 = false;
    if (local_30.Min.y < IVar7.Max.y) {
      bVar4 = false;
      if ((IVar7.Min.y < local_30.Max.y) && (local_30.Min.x < IVar7.Max.x)) {
        bVar4 = IVar7.Min.x < local_30.Max.x;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    if (!g.MouseViewport->GetMainRect().Overlaps(rect_clipped))
        return false;
    return true;
}